

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O2

void fiat_id_GostR3410_2001_TestParamSet_selectznz
               (uint64_t *out1,fiat_id_GostR3410_2001_TestParamSet_uint1 arg1,uint64_t *arg2,
               uint64_t *arg3)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  undefined7 in_register_00000031;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar3 = -(ulong)((int)CONCAT71(in_register_00000031,arg1) != 0);
  uVar4 = ~uVar3;
  auVar5._8_4_ = (int)uVar3;
  auVar5._0_8_ = uVar3;
  auVar5._12_4_ = (int)(uVar3 >> 0x20);
  auVar1 = *(undefined1 (*) [16])(arg3 + 2);
  auVar6._8_4_ = (int)uVar4;
  auVar6._0_8_ = uVar4;
  auVar6._12_4_ = (int)(uVar4 >> 0x20);
  auVar2 = *(undefined1 (*) [16])(arg2 + 2);
  *(undefined1 (*) [16])out1 =
       *(undefined1 (*) [16])arg2 & auVar6 | *(undefined1 (*) [16])arg3 & auVar5;
  *(undefined1 (*) [16])(out1 + 2) = auVar2 & auVar6 | auVar1 & auVar5;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(
    uint64_t *out1, fiat_id_GostR3410_2001_TestParamSet_uint1 arg1,
    uint64_t arg2, uint64_t arg3) {
    fiat_id_GostR3410_2001_TestParamSet_uint1 x1;
    uint64_t x2;
    uint64_t x3;
    x1 = (!(!arg1));
    x2 = ((fiat_id_GostR3410_2001_TestParamSet_int1)(0x0 - x1) &
          UINT64_C(0xffffffffffffffff));
    x3 =
        ((fiat_id_GostR3410_2001_TestParamSet_value_barrier_u64(x2) & arg3) |
         (fiat_id_GostR3410_2001_TestParamSet_value_barrier_u64((~x2)) & arg2));
    *out1 = x3;
}